

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::Convolution1D_x86_fma::create_pipeline(Convolution1D_x86_fma *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  int _h;
  undefined4 *puVar8;
  int i;
  long lVar9;
  long lVar10;
  undefined4 *puVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  int iVar18;
  ulong uVar19;
  undefined4 *puVar20;
  ulong local_c8;
  Mat local_78;
  
  p_Var2 = this->_vptr_Convolution1D_x86_fma[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var2) == 0) {
    uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
    uVar19 = (long)*(int *)(&this->field_0xf0 + (long)p_Var2) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var2);
    uVar13 = (long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
             (long)(int)uVar1;
    _h = (int)uVar13;
    lVar15 = 1;
    uVar19 = 1;
    if (opt->use_packing_layout == true) {
      lVar15 = (ulong)((uVar13 & 3) == 0) * 3 + 1;
      if ((uVar13 & 7) == 0) {
        lVar15 = 8;
      }
      uVar19 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
      if ((uVar1 & 7) == 0) {
        uVar19 = 8;
      }
    }
    p_Var2 = this->_vptr_Convolution1D_x86_fma[-3];
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var2),
                 *(int *)(&this->field_0xd4 + (long)p_Var2),_h,
                 *(int *)(&this->field_0xd0 + (long)p_Var2),(Allocator *)0x0);
    iVar14 = (int)lVar15;
    iVar18 = (int)uVar19;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_fma[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar13 & 0xffffffff) / (long)iVar14
                     ),*(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]) /
                       iVar18,(ulong)(uint)(iVar18 * iVar14 * 4),iVar18 * iVar14,(Allocator *)0x0);
    pp_Var3 = this->_vptr_Convolution1D_x86_fma;
    if (iVar18 <= *(int *)(&this->field_0xd0 + (long)pp_Var3[-3])) {
      pp_Var4 = this->_vptr_Convolution1D_x86_fma;
      pvVar5 = (this->weight_data_packed).data;
      sVar6 = (this->weight_data_packed).cstep;
      sVar7 = (this->weight_data_packed).elemsize;
      local_c8 = 0;
      do {
        if (iVar14 <= _h) {
          puVar8 = (undefined4 *)
                   ((long)(int)((local_c8 & 0xffffffff) / uVar19) * sVar6 * sVar7 + (long)pvVar5);
          puVar20 = (undefined4 *)
                    (local_78.cstep * local_78.elemsize * local_c8 + (long)local_78.data);
          lVar10 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3])) {
              lVar12 = 0;
              puVar11 = puVar20;
              do {
                lVar9 = 0;
                puVar17 = puVar11;
                uVar13 = uVar19;
                puVar16 = puVar11;
                do {
                  do {
                    *puVar8 = *puVar17;
                    puVar8 = puVar8 + 1;
                    uVar13 = uVar13 - 1;
                    puVar17 = (undefined4 *)((long)puVar17 + local_78.cstep * local_78.elemsize);
                  } while (uVar13 != 0);
                  lVar9 = lVar9 + 1;
                  puVar17 = (undefined4 *)((long)puVar16 + (long)local_78.w * local_78.elemsize);
                  uVar13 = uVar19;
                  puVar16 = puVar17;
                } while (lVar9 != lVar15);
                lVar12 = lVar12 + 1;
                puVar11 = puVar11 + 1;
              } while (lVar12 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
            }
            lVar10 = lVar10 + lVar15;
            puVar20 = (undefined4 *)((long)puVar20 + (long)local_78.w * local_78.elemsize * lVar15);
          } while (lVar10 < (long)((long)_h - (ulong)(iVar14 - 1)));
        }
        local_c8 = local_c8 + uVar19;
      } while ((long)((iVar18 - 1) + local_c8) <
               (long)*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}